

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walksymbol.c
# Opt level: O3

void dmrC_init_symbol_visitor(symbol_visitor *visitor)

{
  visitor->data = (void *)0x0;
  visitor->id = 0;
  visitor->begin_symbol = begin_symbol_default;
  visitor->end_symbol = end_symbol_default;
  visitor->begin_struct_members = begin_members_default;
  visitor->end_struct_members = end_members_default;
  visitor->begin_func_arguments = begin_arguments_default;
  visitor->end_func_arguments = end_arguments_default;
  visitor->reference_symbol = reference_symbol_default;
  visitor->begin_func_body = begin_body_default;
  visitor->end_func_body = end_body_default;
  visitor->begin_func_returntype = begin_func_returntype_default;
  visitor->end_func_returntype = end_func_returntype_default;
  visitor->begin_basetype = begin_basetype_default;
  visitor->end_basetype = end_basetype_default;
  visitor->begin_initializer = begin_initializer_default;
  visitor->end_initializer = end_initializer_default;
  visitor->string_literal = string_expression_default;
  visitor->float_literal = float_literal_default;
  visitor->int_literal = int_literal_default;
  visitor->begin_statement = begin_statement_default;
  visitor->end_statement = end_statement_default;
  visitor->begin_expression = begin_expression_default;
  visitor->end_expression = end_expression_default;
  visitor->begin_assignment_expression = begin_assignment_expression_default;
  visitor->end_assignment_expression = end_assignment_expression_default;
  visitor->begin_binop_expression = begin_binop_expression_default;
  visitor->end_binop_expression = end_binop_expression_default;
  visitor->begin_preop_expression = begin_preop_expression_default;
  visitor->end_preop_expression = end_preop_expression_default;
  visitor->begin_postop_expression = begin_postop_expression_default;
  visitor->end_postop_expression = end_postop_expression_default;
  visitor->begin_direct_call_expression = begin_direct_call_expression_default;
  visitor->begin_indirect_call_expression = begin_indirect_call_expression_default;
  visitor->end_call_expression = end_call_expression_default;
  visitor->begin_callarg_expression = begin_callarg_expression_default;
  visitor->end_callarg_expression = end_callarg_expression_default;
  visitor->begin_cast_expression = begin_cast_expression_default;
  visitor->end_cast_expression = end_cast_expression_default;
  visitor->begin_conditional_expression = begin_conditional_expression_default;
  visitor->end_conditional_expression = end_conditional_expression_default;
  visitor->begin_label_expression = begin_label_expression_default;
  visitor->end_label_expression = end_label_expression_default;
  visitor->do_expression_identifier = do_expression_identifier_default;
  visitor->do_expression_index = do_expression_index_default;
  visitor->begin_expression_position = begin_expression_position_default;
  visitor->end_expression_position = end_expression_position_default;
  visitor->begin_initialization = begin_initialization_default;
  visitor->end_initialization = end_initialization_default;
  visitor->begin_label = begin_label_default;
  visitor->end_label = end_label_default;
  visitor->begin_iterator_prestatement = begin_iterator_prestatement_default;
  visitor->end_iterator_prestatement = end_iterator_prestatement_default;
  visitor->begin_iterator_precondition = begin_iterator_precondition_default;
  visitor->end_iterator_precondition = end_iterator_precondition_default;
  visitor->begin_iterator_statement = begin_iterator_statement_default;
  visitor->end_iterator_statement = end_iterator_statement_default;
  visitor->begin_iterator_postcondition = begin_iterator_postcondition_default;
  visitor->end_iterator_postcondition = end_iterator_postcondition_default;
  visitor->begin_iterator_poststatement = begin_iterator_poststatement_default;
  visitor->end_iterator_poststatement = end_iterator_poststatement_default;
  visitor->begin_case_value = begin_case_value_default;
  visitor->begin_case_range = begin_case_range_default;
  visitor->begin_default_case = begin_default_case_default;
  visitor->end_case = end_case_default;
  visitor->begin_if_then = begin_if_then_default;
  visitor->end_if_then = end_if_then_default;
  visitor->begin_if_else = begin_if_else_default;
  visitor->end_if_else = end_if_else_default;
  return;
}

Assistant:

void dmrC_init_symbol_visitor(struct symbol_visitor *visitor)
{
	visitor->data = NULL;
	visitor->id = 0;
	visitor->begin_symbol = begin_symbol_default;
	visitor->end_symbol = end_symbol_default;
	visitor->begin_struct_members = begin_members_default;
	visitor->end_struct_members = end_members_default;
	visitor->begin_func_arguments = begin_arguments_default;
	visitor->end_func_arguments = end_arguments_default;
	visitor->reference_symbol = reference_symbol_default;
	visitor->begin_func_body = begin_body_default;
	visitor->end_func_body = end_body_default;
	visitor->begin_func_returntype = begin_func_returntype_default;
	visitor->end_func_returntype = end_func_returntype_default;
	visitor->begin_basetype = begin_basetype_default;
	visitor->end_basetype = end_basetype_default;
	visitor->begin_initializer = begin_initializer_default;
	visitor->end_initializer = end_initializer_default;
	visitor->string_literal = string_expression_default;
	visitor->float_literal = float_literal_default;
	visitor->int_literal = int_literal_default;
	visitor->begin_statement = begin_statement_default;
	visitor->end_statement = end_statement_default;
	visitor->begin_expression = begin_expression_default;
	visitor->end_expression = end_expression_default;
	visitor->begin_assignment_expression = begin_assignment_expression_default;
	visitor->end_assignment_expression = end_assignment_expression_default;
	visitor->begin_binop_expression = begin_binop_expression_default;
	visitor->end_binop_expression = end_binop_expression_default;
	visitor->begin_preop_expression = begin_preop_expression_default;
	visitor->end_preop_expression = end_preop_expression_default;
	visitor->begin_postop_expression = begin_postop_expression_default;
	visitor->end_postop_expression = end_postop_expression_default;
	visitor->begin_direct_call_expression = begin_direct_call_expression_default;
	visitor->begin_indirect_call_expression = begin_indirect_call_expression_default;
	visitor->end_call_expression = end_call_expression_default;
	visitor->begin_callarg_expression = begin_callarg_expression_default;
	visitor->end_callarg_expression = end_callarg_expression_default;
	visitor->begin_cast_expression = begin_cast_expression_default;
	visitor->end_cast_expression = end_cast_expression_default;
	visitor->begin_conditional_expression = begin_conditional_expression_default;
	visitor->end_conditional_expression = end_conditional_expression_default;
	visitor->begin_label_expression = begin_label_expression_default;
	visitor->end_label_expression = end_label_expression_default;
	visitor->do_expression_identifier = do_expression_identifier_default;
	visitor->do_expression_index = do_expression_index_default;
	visitor->begin_expression_position = begin_expression_position_default;
	visitor->end_expression_position = end_expression_position_default;
	visitor->begin_initialization = begin_initialization_default;
	visitor->end_initialization = end_initialization_default;
	visitor->begin_label = begin_label_default;
	visitor->end_label = end_label_default;
	visitor->begin_iterator_prestatement = begin_iterator_prestatement_default;
	visitor->end_iterator_prestatement = end_iterator_prestatement_default;
	visitor->begin_iterator_precondition = begin_iterator_precondition_default;
	visitor->end_iterator_precondition = end_iterator_precondition_default;
	visitor->begin_iterator_statement = begin_iterator_statement_default;
	visitor->end_iterator_statement = end_iterator_statement_default;
	visitor->begin_iterator_postcondition = begin_iterator_postcondition_default;
	visitor->end_iterator_postcondition = end_iterator_postcondition_default;
	visitor->begin_iterator_poststatement = begin_iterator_poststatement_default;
	visitor->end_iterator_poststatement = end_iterator_poststatement_default;
	visitor->begin_case_value = begin_case_value_default;
	visitor->begin_case_range = begin_case_range_default;
	visitor->begin_default_case = begin_default_case_default;
	visitor->end_case = end_case_default;
	visitor->begin_if_then = begin_if_then_default;
	visitor->end_if_then = end_if_then_default;
	visitor->begin_if_else = begin_if_else_default;
	visitor->end_if_else = end_if_else_default;
}